

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O2

bool __thiscall
duckdb::StreamQueryResult::IsOpenInternal(StreamQueryResult *this,ClientContextLock *lock)

{
  bool bVar1;
  ClientContext *this_00;
  
  if (((this->super_QueryResult).super_BaseQueryResult.success == true) &&
     ((this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0)) {
    this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
    bVar1 = ClientContext::IsActiveResult(this_00,lock,(BaseQueryResult *)this);
    return bVar1;
  }
  return false;
}

Assistant:

bool StreamQueryResult::IsOpenInternal(ClientContextLock &lock) {
	bool invalidated = !success || !context;
	if (!invalidated) {
		invalidated = !context->IsActiveResult(lock, *this);
	}
	return !invalidated;
}